

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O1

bool anon_unknown.dwarf_8b94::SolverDpllTriadSimd<0>::BoxRestrict<1>
               (State *state,int box_idx,Cells16 *candidates)

{
  Cells08 *pCVar1;
  longlong *plVar2;
  Box *pBVar3;
  int band_idx;
  int from_peer;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined8 uVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  bool bVar11;
  long lVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  
  auVar10 = (anonymous_namespace)::tables._6080_32_;
  auVar9 = (anonymous_namespace)::tables._6048_32_;
  auVar8 = (anonymous_namespace)::tables._6016_32_;
  auVar7 = _DAT_0010b060;
  lVar12 = (long)box_idx;
  auVar20 = *(undefined1 (*) [32])state->boxen[lVar12].cells.vec;
  bVar11 = true;
  if ((auVar20 & ~*(undefined1 (*) [32])candidates->vec) != (undefined1  [32])0x0) {
    pBVar3 = state->boxen + lVar12;
    band_idx = *(int *)((anonymous_namespace)::tables + lVar12 * 4 + 0x18b8);
    from_peer = *(int *)((anonymous_namespace)::tables + lVar12 * 4 + 0x18dc);
    pCVar1 = &state->bands[0][band_idx].eliminations;
    plVar2 = state->boxen[(long)from_peer + -3].cells.vec + 2;
    auVar20 = vpandn_avx2(*(undefined1 (*) [32])candidates->vec,auVar20);
    lVar12 = (long)(from_peer * 3 + band_idx) * 0x20;
    auVar5 = vpmovsxbw_avx2(_DAT_0010aae0);
    do {
      auVar13 = vpandn_avx2(auVar20,*(undefined1 (*) [32])(pBVar3->cells).vec);
      *(undefined1 (*) [32])(pBVar3->cells).vec = auVar13;
      auVar13 = vpopcntw_avx512_bitalg(auVar13);
      uVar6 = vpcmpw_avx512vl(auVar13,auVar5,1);
      if ((short)uVar6 != 0) goto LAB_00106fc1;
      auVar18 = vpcmpeqw_avx2(auVar13,auVar5);
      auVar13 = *(undefined1 (*) [32])(pBVar3->cells).vec;
      auVar18 = vpand_avx2(auVar13,auVar18);
      auVar14 = vprolq_avx512vl(auVar13,0x10);
      auVar17 = vpand_avx2(auVar14,auVar13);
      auVar14 = vpor_avx2(auVar14,auVar13);
      auVar15 = vprolq_avx512vl(auVar13,0x20);
      auVar16 = vpternlogd_avx512vl(auVar17,auVar15,auVar14,0xf8);
      auVar17 = vpor_avx2(auVar15,auVar14);
      auVar13 = vprolq_avx512vl(auVar13,0x30);
      auVar17 = vpternlogd_avx512vl(auVar13,auVar17,auVar16,0xea);
      auVar13 = *(undefined1 (*) [32])(pBVar3->cells).vec;
      auVar15 = vpternlogd_avx512vl(auVar17,auVar13,auVar18,0xae);
      auVar17 = vpermq_avx2(auVar13,0x39);
      auVar18 = vpand_avx2(auVar13,auVar17);
      auVar17 = vpor_avx2(auVar13,auVar17);
      auVar14 = vpermq_avx2(auVar13,0x4e);
      auVar16 = vpternlogd_avx512vl(auVar18,auVar14,auVar17,0xf8);
      auVar18 = vpor_avx2(auVar14,auVar17);
      auVar17 = vpermq_avx2(auVar13,0x93);
      auVar18 = vpternlogd_avx512vl(auVar17,auVar18,auVar16,0xea);
      auVar19 = vpternlogd_avx512vl(auVar18,auVar13,auVar15,0xae);
      auVar13 = vpand_avx2(auVar19,auVar8);
      auVar18 = vprolq_avx512vl(auVar13,0x10);
      auVar17 = vpor_avx2(auVar18,auVar13);
      auVar16 = vpshufd_avx2(auVar17,0xb1);
      auVar18 = vpermq_avx2(auVar13,0x39);
      auVar18 = vpor_avx2(auVar18,auVar13);
      auVar14 = vpermq_avx2(auVar18,0x4e);
      auVar18 = vpor_avx2(auVar14,auVar18);
      auVar14 = vpshufb_avx2(auVar18,auVar9);
      auVar15 = vpshufb_avx2(auVar18,auVar10);
      auVar14 = vpternlogd_avx512vl(auVar15,auVar18,auVar14,0xfe);
      auVar18 = vpcmpgtw_avx2(auVar13,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      auVar17 = vpor_avx2(auVar16,auVar17);
      auVar18 = vpternlogd_avx512vl(auVar17,auVar14,auVar18,0xfe);
      auVar20 = vpternlogd_avx512vl(auVar20,auVar18,auVar13,0xf6);
      auVar13 = vpshufb_avx2(auVar19,auVar7);
      auVar4 = vpor_avx(auVar13._16_16_,auVar13._0_16_);
      auVar17._0_16_ = ZEXT116(0) * auVar19._16_16_ + ZEXT116(1) * auVar4;
      auVar17._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar19._16_16_
      ;
      auVar13 = vpshufb_avx2(auVar18,auVar7);
      auVar4 = vpor_avx(auVar13._16_16_,auVar13._0_16_);
      auVar14._0_16_ = ZEXT116(0) * auVar18._16_16_ + ZEXT116(1) * auVar4;
      auVar14._16_16_ = ZEXT116(1) * auVar18._16_16_;
      auVar13 = vpshufb_avx2(auVar17,*(undefined1 (*) [32])
                                      ((anonymous_namespace)::tables + lVar12 + 0x1360));
      auVar18 = vpshufb_avx2(auVar14,*(undefined1 (*) [32])
                                      ((anonymous_namespace)::tables + lVar12 + 0x1480));
      auVar17 = vpshufb_avx2(auVar14,*(undefined1 (*) [32])
                                      ((anonymous_namespace)::tables + lVar12 + 0x15a0));
      auVar13 = vpternlogd_avx512vl(auVar17,auVar13,auVar18,0xfe);
      auVar4 = vpor_avx(auVar13._0_16_,*(undefined1 (*) [16])pCVar1->vec);
      *(undefined1 (*) [16])pCVar1->vec = auVar4;
      auVar4 = vpor_avx(auVar13._16_16_,*(undefined1 (*) [16])plVar2);
      *(undefined1 (*) [16])plVar2 = auVar4;
    } while ((*(undefined1 (*) [32])(pBVar3->cells).vec & auVar20) != (undefined1  [32])0x0);
    bVar11 = BandEliminate<0>(state,band_idx,from_peer);
    if (bVar11) {
      bVar11 = BandEliminate<1>(state,from_peer,band_idx);
      return bVar11;
    }
LAB_00106fc1:
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

static bool BoxRestrict(State &state, int box_idx, const Cells16 &candidates) {
        // return immediately if there are no new eliminations
        Box &box = state.boxen[box_idx];
        if (box.cells.SubsetOf(candidates)) return true;
        auto eliminating = box.cells.and_not(candidates);

        int box_i = tables.div3[box_idx];
        int box_j = tables.mod3[box_idx];

        Band &h_band = state.bands[0][box_i];
        Band &v_band = state.bands[1][box_j];
        do {
            // apply eliminations and check that no cell clause now violates its minimum
            box.cells = box.cells.and_not(eliminating);
            Cells16 counts = box.cells.Popcounts9();
            const Cells16 box_minimums{1, 1, 1, 6, 1, 1, 1, 6, 1, 1, 1, 6, 6, 6, 6, 0};
            if (counts.AnyLessThan(box_minimums)) return false;

            // gather literals asserted by triggered cell clauses
            Cells16 triggered = counts.WhichEqual(box_minimums);
            Cells16 all_assertions = box.cells & triggered;
            // and add literals asserted by triggered triad definition clauses
            GatherTriadClauseAssertions(
                    box.cells, [](const Cells16 &x) { return x.RotateRows(); }, all_assertions);
            GatherTriadClauseAssertions(
                    box.cells, [](const Cells16 &x) { return x.RotateCols(); }, all_assertions);

            // construct elimination messages for this box and for our band peers
            AssertionsToEliminations(all_assertions, box_i, box_j, eliminating,
                                     h_band.eliminations, v_band.eliminations);

        } while (eliminating.Intersects(box.cells));

        // send elimination messages to horizontal and vertical peers. Prefer to send the first
        // of these messages to the peer whose orientation is opposite that of the inbound peer.
        if (from_vertical) {
            return BandEliminate<0>(state, box_i, box_j) &&
                   BandEliminate<1>(state, box_j, box_i);
        } else {
            return BandEliminate<1>(state, box_j, box_i) &&
                   BandEliminate<0>(state, box_i, box_j);
        }
    }